

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onb.h
# Opt level: O0

vec3 * __thiscall onb::transform(vec3 *__return_storage_ptr__,onb *this,vec3 *v)

{
  double dVar1;
  vec3 local_78;
  vec3 local_60;
  vec3 local_48;
  vec3 local_30;
  vec3 *local_18;
  vec3 *v_local;
  onb *this_local;
  
  local_18 = v;
  v_local = this->axis;
  dVar1 = vec3::operator[](v,0);
  operator*(&local_48,dVar1,this->axis);
  dVar1 = vec3::operator[](local_18,1);
  operator*(&local_60,dVar1,this->axis + 1);
  operator+(&local_30,&local_48,&local_60);
  dVar1 = vec3::operator[](local_18,2);
  operator*(&local_78,dVar1,this->axis + 2);
  operator+(__return_storage_ptr__,&local_30,&local_78);
  return __return_storage_ptr__;
}

Assistant:

vec3 transform(const vec3& v) const {
        // Transform from basis coordinates to local space.
        return (v[0] * axis[0]) + (v[1] * axis[1]) + (v[2] * axis[2]);
    }